

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O0

void gnilk::Logger::SetAllSinkDebugLevel(LogLevel newDebugLevel)

{
  LogManager *this;
  anon_class_4_1_b4c16cd1 local_34;
  SinkDelegate local_30;
  LogLevel local_c;
  LogLevel newDebugLevel_local;
  
  local_c = newDebugLevel;
  this = LogManager::Instance();
  local_34.newDebugLevel = local_c;
  std::function<bool(gnilk::LogSink*)>::
  function<gnilk::Logger::SetAllSinkDebugLevel(gnilk::LogLevel)::__0,void>
            ((function<bool(gnilk::LogSink*)> *)&local_30,&local_34);
  LogManager::IterateSinks(this,&local_30);
  std::function<bool_(gnilk::LogSink_*)>::~function(&local_30);
  return;
}

Assistant:

void Logger::SetAllSinkDebugLevel(LogLevel newDebugLevel) {
    LogManager::Instance().IterateSinks([newDebugLevel](LogSink *sink) {
        sink->SetLogLevelThreshold(newDebugLevel);
        return true;
    });
}